

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_dppd_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t mask)

{
  float64 fVar1;
  float64 local_50;
  float64 local_48;
  float64 local_30;
  float64 iresult;
  uint32_t mask_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  local_30 = 0;
  if ((mask & 0x10) != 0) {
    fVar1 = float64_mul_x86_64(d->_d_ZMMReg[0],s->_d_ZMMReg[0],&env->sse_status);
    local_30 = float64_add_x86_64(0,fVar1,&env->sse_status);
  }
  if ((mask & 0x20) != 0) {
    fVar1 = float64_mul_x86_64(d->_d_ZMMReg[1],s->_d_ZMMReg[1],&env->sse_status);
    local_30 = float64_add_x86_64(local_30,fVar1,&env->sse_status);
  }
  if ((mask & 1) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = local_30;
  }
  d->_d_ZMMReg[0] = local_48;
  if ((mask & 2) == 0) {
    local_50 = 0;
  }
  else {
    local_50 = local_30;
  }
  d->_d_ZMMReg[1] = local_50;
  return;
}

Assistant:

void glue(helper_dppd, SUFFIX)(CPUX86State *env, Reg *d, Reg *s, uint32_t mask)
{
    float64 iresult = float64_zero;

    if (mask & (1 << 4)) {
        iresult = float64_add(iresult,
                              float64_mul(d->ZMM_D(0), s->ZMM_D(0),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 5)) {
        iresult = float64_add(iresult,
                              float64_mul(d->ZMM_D(1), s->ZMM_D(1),
                                          &env->sse_status),
                              &env->sse_status);
    }
    d->ZMM_D(0) = (mask & (1 << 0)) ? iresult : float64_zero;
    d->ZMM_D(1) = (mask & (1 << 1)) ? iresult : float64_zero;
}